

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l10n.c
# Opt level: O1

l10n_arg * get_arg(l10n_arg *args,char *token)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  if (args == (l10n_arg *)0x0) {
    __assert_fail("args",
                  "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/l10n.c",
                  0x3e,"l10n_arg *get_arg(l10n_arg *, const char *)");
  }
  lVar3 = 0;
  while( true ) {
    lVar1 = *(long *)((long)&args->name + lVar3);
    if (lVar1 == 0) {
      return (l10n_arg *)0x0;
    }
    iVar2 = strcmp((char *)(lVar1 + 1),token);
    if (iVar2 == 0) break;
    lVar3 = lVar3 + 0x10;
    if (lVar3 == 0x80) {
      return (l10n_arg *)0x0;
    }
  }
  return (l10n_arg *)((long)&args->name + lVar3);
}

Assistant:

static l10n_arg *get_arg(l10n_arg *args, const char *token)
{
    int i;

    assert(args);
    for (i = 0; i != NUM_ARGS && args[i].name; ++i) {
        if (strcmp(args[i].name + 1, token) == 0) {
            return args + i;
        }
    }
    return NULL;
}